

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack25_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  uVar2 = in[1];
  *out = uVar1 & 0x1ffffff;
  out[1] = uVar1 >> 0x19;
  out[1] = uVar1 >> 0x19 | (uVar2 & 0x3ffff) << 7;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x12;
  out[2] = uVar2 >> 0x12 | (uVar1 & 0x7ff) << 0xe;
  out[3] = uVar1 >> 0xb;
  uVar2 = in[3];
  out[3] = uVar1 >> 0xb | (uVar2 & 0xf) << 0x15;
  out[4] = uVar2 >> 4 & 0x1ffffff;
  out[5] = uVar2 >> 0x1d;
  uVar1 = in[4];
  out[5] = uVar2 >> 0x1d | (uVar1 & 0x3fffff) << 3;
  out[6] = uVar1 >> 0x16;
  uVar2 = in[5];
  out[6] = uVar1 >> 0x16 | (uVar2 & 0x7fff) << 10;
  uVar1 = in[6];
  out[7] = uVar2 >> 0xf;
  out[7] = (uVar1 & 0xff) << 0x11 | uVar2 >> 0xf;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack25_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 18)) << (25 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 11)) << (25 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 4)) << (25 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 25);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 22)) << (25 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 15)) << (25 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 8)) << (25 - 8);
  out++;

  return in + 1;
}